

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall
lzham::lzcompressor::state::get_rep_match_costs
          (state *this,uint dict_pos,bit_cost_t *pBitcosts,uint match_hist_index,int min_len,
          int max_len,uint is_match_model_index)

{
  bit_cost_t bVar1;
  bit_cost_t bVar2;
  bit_cost_t bVar3;
  long lVar4;
  int in_ECX;
  long in_RDX;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  uint in_stack_00000008;
  int match_len_1;
  int match_len;
  bit_cost_t rep0_match_base_cost;
  bit_cost_t base_cost;
  sym_data_model *rep_len_table;
  uint in_stack_ffffffffffffff8c;
  raw_quasi_adaptive_huffman_data_model *in_stack_ffffffffffffff90;
  raw_quasi_adaptive_huffman_data_model *prVar5;
  int local_48;
  int local_44;
  raw_quasi_adaptive_huffman_data_model *local_38;
  int local_20;
  
  bVar1 = adaptive_bit_model::get_cost
                    ((adaptive_bit_model *)(in_RDI + 0x1c + (ulong)in_stack_00000008 * 2),1);
  bVar2 = adaptive_bit_model::get_cost
                    ((adaptive_bit_model *)(in_RDI + 0x61c + (ulong)*(uint *)(in_RDI + 4) * 2),1);
  if (in_ECX == 0) {
    bVar3 = adaptive_bit_model::get_cost
                      ((adaptive_bit_model *)(in_RDI + 0x634 + (ulong)*(uint *)(in_RDI + 4) * 2),1);
    local_38 = (raw_quasi_adaptive_huffman_data_model *)(bVar3 + bVar2 + bVar1);
  }
  else {
    bVar3 = adaptive_bit_model::get_cost
                      ((adaptive_bit_model *)(in_RDI + 0x634 + (ulong)*(uint *)(in_RDI + 4) * 2),0);
    lVar4 = bVar3 + bVar2 + bVar1;
    if (in_ECX == 1) {
      bVar1 = adaptive_bit_model::get_cost
                        ((adaptive_bit_model *)(in_RDI + 0x664 + (ulong)*(uint *)(in_RDI + 4) * 2),1
                        );
      local_38 = (raw_quasi_adaptive_huffman_data_model *)(bVar1 + lVar4);
    }
    else {
      bVar1 = adaptive_bit_model::get_cost
                        ((adaptive_bit_model *)(in_RDI + 0x664 + (ulong)*(uint *)(in_RDI + 4) * 2),0
                        );
      if (in_ECX == 2) {
        bVar2 = adaptive_bit_model::get_cost
                          ((adaptive_bit_model *)(in_RDI + 0x67c + (ulong)*(uint *)(in_RDI + 4) * 2)
                           ,1);
      }
      else {
        bVar2 = adaptive_bit_model::get_cost
                          ((adaptive_bit_model *)(in_RDI + 0x67c + (ulong)*(uint *)(in_RDI + 4) * 2)
                           ,0);
      }
      local_38 = (raw_quasi_adaptive_huffman_data_model *)(bVar2 + bVar1 + lVar4);
    }
  }
  local_48 = in_R8D;
  if (in_ECX == 0) {
    local_20 = in_R8D;
    if (in_R8D == 1) {
      bVar1 = adaptive_bit_model::get_cost
                        ((adaptive_bit_model *)(in_RDI + 0x64c + (ulong)*(uint *)(in_RDI + 4) * 2),1
                        );
      *(bit_cost_t *)(in_RDX + 8) = (long)&(local_38->m_sym_freq).m_p + bVar1;
      local_20 = 2;
    }
    bVar1 = adaptive_bit_model::get_cost
                      ((adaptive_bit_model *)(in_RDI + 0x64c + (ulong)*(uint *)(in_RDI + 4) * 2),0);
    for (local_44 = local_20; local_44 <= in_R9D; local_44 = local_44 + 1) {
      bVar2 = raw_quasi_adaptive_huffman_data_model::get_cost
                        (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
      *(bit_cost_t *)(in_RDX + (long)local_44 * 8) =
           (long)&(local_38->m_sym_freq).m_p + bVar2 + bVar1;
    }
  }
  else {
    for (; local_48 <= in_R9D; local_48 = local_48 + 1) {
      prVar5 = local_38;
      bVar1 = raw_quasi_adaptive_huffman_data_model::get_cost(local_38,in_stack_ffffffffffffff8c);
      *(bit_cost_t *)(in_RDX + (long)local_48 * 8) = (long)&(prVar5->m_sym_freq).m_p + bVar1;
    }
  }
  return;
}

Assistant:

void lzcompressor::state::get_rep_match_costs(uint dict_pos, bit_cost_t *pBitcosts, uint match_hist_index, int min_len, int max_len, uint is_match_model_index) const
   {
      dict_pos;
      // match
      const sym_data_model &rep_len_table = m_rep_len_table[m_cur_state >= CLZBase::cNumLitStates];

      bit_cost_t base_cost = m_is_match_model[is_match_model_index].get_cost(1);

      base_cost += m_is_rep_model[m_cur_state].get_cost(1);

      if (!match_hist_index)
      {
         // rep0 match
         base_cost += m_is_rep0_model[m_cur_state].get_cost(1);
      }
      else
      {
         // rep1-rep3 matches
         base_cost += m_is_rep0_model[m_cur_state].get_cost(0);

         if (match_hist_index == 1)
         {
            // rep1
            base_cost += m_is_rep1_model[m_cur_state].get_cost(1);
         }
         else
         {
            base_cost += m_is_rep1_model[m_cur_state].get_cost(0);

            if (match_hist_index == 2)
            {
               // rep2
               base_cost += m_is_rep2_model[m_cur_state].get_cost(1);
            }
            else
            {
               // rep3
               base_cost += m_is_rep2_model[m_cur_state].get_cost(0);
            }
         }
      }

      // rep match
      if (!match_hist_index)
      {
         if (min_len == 1)
         {
            // single byte rep0
            pBitcosts[1] = base_cost + m_is_rep0_single_byte_model[m_cur_state].get_cost(1);
            min_len++;
         }

         bit_cost_t rep0_match_base_cost = base_cost + m_is_rep0_single_byte_model[m_cur_state].get_cost(0);
         for (int match_len = min_len; match_len <= max_len; match_len++)
         {
            // normal rep0
            pBitcosts[match_len] = rep0_match_base_cost + rep_len_table.get_cost(match_len - cMinMatchLen);
         }
      }
      else
      {
         for (int match_len = min_len; match_len <= max_len; match_len++)
         {
            pBitcosts[match_len] = base_cost + rep_len_table.get_cost(match_len - cMinMatchLen);
         }
      }
   }